

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O0

void Cec_ManLSCorrespondenceBmc(Gia_Man_t *pAig,Cec_ParCor_t *pPars,int nPrefs)

{
  Vec_Int_t *vStatus_00;
  int iVar1;
  Cec_ManSim_t *pSim_00;
  abctime aVar2;
  Gia_Man_t *p;
  abctime aVar3;
  bool bVar4;
  abctime clkBmc;
  int RetValue;
  int fChanges;
  Gia_Man_t *pSrm;
  Cec_ManSim_t *pSim;
  Vec_Int_t *vCexStore;
  Vec_Int_t *vOutputs;
  Vec_Str_t *vStatus;
  Cec_ParSat_t *pParsSat;
  Cec_ParSat_t ParsSat;
  Cec_ParSim_t *pParsSim;
  Cec_ParSim_t ParsSim;
  int nPrefs_local;
  Cec_ParCor_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  ParsSat._28_8_ = (long)&pParsSim + 4;
  vStatus = (Vec_Str_t *)((long)&pParsSat + 4);
  ParsSim.fVeryVerbose = nPrefs;
  unique0x1000026f = pPars;
  Cec_ManSimSetDefaultParams((Cec_ParSim_t *)ParsSat._28_8_);
  *(int *)ParsSat._28_8_ = stack0xffffffffffffffe8->nWords;
  *(int *)(ParsSat._28_8_ + 4) = stack0xffffffffffffffe8->nRounds;
  *(int *)(ParsSat._28_8_ + 0x2c) = stack0xffffffffffffffe8->fVerbose;
  *(int *)(ParsSat._28_8_ + 0x20) = stack0xffffffffffffffe8->fLatchCorr;
  *(undefined4 *)(ParsSat._28_8_ + 0x1c) = 1;
  pSim_00 = Cec_ManSimStart(pAig,(Cec_ParSim_t *)ParsSat._28_8_);
  Cec_ManSatSetDefaultParams((Cec_ParSat_t *)vStatus);
  vStatus->nCap = stack0xffffffffffffffe8->nBTLimit;
  vStatus[2].nCap = stack0xffffffffffffffe8->fVerbose;
  bVar4 = true;
  do {
    if (!bVar4) {
LAB_007eaada:
      Cec_ManSimStop(pSim_00);
      return;
    }
    aVar2 = Abc_Clock();
    p = Gia_ManCorrSpecReduceInit
                  (pAig,stack0xffffffffffffffe8->nFrames,ParsSim.fVeryVerbose,
                   (uint)((stack0xffffffffffffffe8->fLatchCorr != 0 ^ 0xffU) & 1),&vCexStore,
                   stack0xffffffffffffffe8->fUseRings);
    iVar1 = Gia_ManPoNum(p);
    if (iVar1 == 0) {
      Gia_ManStop(p);
      Vec_IntFree(vCexStore);
      goto LAB_007eaada;
    }
    vStatus->nCap = vStatus->nCap * 10;
    if (stack0xffffffffffffffe8->fUseCSat == 0) {
      pSim = (Cec_ManSim_t *)Cec_ManSatSolveMiter(p,(Cec_ParSat_t *)vStatus,(Vec_Str_t **)&vOutputs)
      ;
    }
    else {
      pSim = (Cec_ManSim_t *)
             Tas_ManSolveMiterNc(p,stack0xffffffffffffffe8->nBTLimit,(Vec_Str_t **)&vOutputs,0);
    }
    iVar1 = Vec_IntSize((Vec_Int_t *)pSim);
    bVar4 = iVar1 != 0;
    if (bVar4) {
      Cec_ManResimulateCounterExamples
                (pSim_00,(Vec_Int_t *)pSim,
                 stack0xffffffffffffffe8->nFrames + 1 + ParsSim.fVeryVerbose);
      Gia_ManCheckRefinements
                (pAig,(Vec_Str_t *)vOutputs,vCexStore,pSim_00,stack0xffffffffffffffe8->fUseRings);
    }
    vStatus_00 = vOutputs;
    if (stack0xffffffffffffffe8->fVerbose != 0) {
      aVar3 = Abc_Clock();
      Cec_ManRefinedClassPrintStats(pAig,(Vec_Str_t *)vStatus_00,-1,aVar3 - aVar2);
    }
    Vec_IntFree((Vec_Int_t *)pSim);
    Vec_StrFree((Vec_Str_t *)vOutputs);
    Gia_ManStop(p);
    Vec_IntFree(vCexStore);
  } while( true );
}

Assistant:

void Cec_ManLSCorrespondenceBmc( Gia_Man_t * pAig, Cec_ParCor_t * pPars, int nPrefs )
{  
    Cec_ParSim_t ParsSim, * pParsSim = &ParsSim;
    Cec_ParSat_t ParsSat, * pParsSat = &ParsSat;
    Vec_Str_t * vStatus;
    Vec_Int_t * vOutputs;
    Vec_Int_t * vCexStore;
    Cec_ManSim_t * pSim;
    Gia_Man_t * pSrm;
    int fChanges, RetValue;
    // prepare simulation manager
    Cec_ManSimSetDefaultParams( pParsSim );
    pParsSim->nWords     = pPars->nWords;
    pParsSim->nFrames    = pPars->nRounds;
    pParsSim->fVerbose   = pPars->fVerbose;
    pParsSim->fLatchCorr = pPars->fLatchCorr;
    pParsSim->fSeqSimulate = 1;
    pSim = Cec_ManSimStart( pAig, pParsSim );
    // prepare SAT solving
    Cec_ManSatSetDefaultParams( pParsSat );
    pParsSat->nBTLimit = pPars->nBTLimit;
    pParsSat->fVerbose = pPars->fVerbose;
    fChanges = 1;
    while ( fChanges )
    {
        abctime clkBmc = Abc_Clock();
        fChanges = 0;
        pSrm = Gia_ManCorrSpecReduceInit( pAig, pPars->nFrames, nPrefs, !pPars->fLatchCorr, &vOutputs, pPars->fUseRings );
        if ( Gia_ManPoNum(pSrm) == 0 )
        {
            Gia_ManStop( pSrm );
            Vec_IntFree( vOutputs );
            break;
        } 
        pParsSat->nBTLimit *= 10;
        if ( pPars->fUseCSat )
            vCexStore = Tas_ManSolveMiterNc( pSrm, pPars->nBTLimit, &vStatus, 0 );
        else
            vCexStore = Cec_ManSatSolveMiter( pSrm, pParsSat, &vStatus );
        // refine classes with these counter-examples
        if ( Vec_IntSize(vCexStore) )
        {
            RetValue = Cec_ManResimulateCounterExamples( pSim, vCexStore, pPars->nFrames + 1 + nPrefs );
            Gia_ManCheckRefinements( pAig, vStatus, vOutputs, pSim, pPars->fUseRings );
            fChanges = 1;
        }
        if ( pPars->fVerbose )
            Cec_ManRefinedClassPrintStats( pAig, vStatus, -1, Abc_Clock() - clkBmc );
        // recycle
        Vec_IntFree( vCexStore );
        Vec_StrFree( vStatus );
        Gia_ManStop( pSrm );
        Vec_IntFree( vOutputs );
    }
    Cec_ManSimStop( pSim );
}